

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_MMDP_OnlineSolve.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  NullPlanner *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  long *plVar4;
  double dVar5;
  row_t row;
  QTable q;
  MDPValueIteration vi;
  SimulationDecPOMDPDiscrete sim;
  Arguments args;
  undefined1 *local_328;
  undefined8 local_320;
  undefined1 local_318 [8];
  undefined1 local_310 [24];
  long local_2f8;
  void *local_2f0;
  MDPValueIteration local_2e8 [64];
  SimulationDecPOMDPDiscrete local_2a8 [80];
  Arguments local_258;
  
  ArgumentHandlers::Arguments::Arguments(&local_258);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&local_258);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Instantiating the problem...",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pDVar1 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...done.",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,999999,pDVar1,(PlanningUnitMADPDiscreteParameters *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Performing value iteration...",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  MDPValueIteration::MDPValueIteration(local_2e8,(PlanningUnitDecPOMDPDiscrete *)this);
  MDPValueIteration::Plan();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...done.",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  MDPValueIteration::GetQTable((uint)local_318);
  local_328 = local_310;
  local_320 = 0;
  *(undefined8 *)(NullPlanner::NullPlanner + *(long *)(std::cout + -0x18)) = 7;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Here\'s first row (state 0) from VI result: \n",0x2c);
  pbVar2 = boost::numeric::ublas::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                       *)&local_328);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar2 + -0x18) + (char)pbVar2);
  std::ostream::put((char)pbVar2);
  std::ostream::flush();
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_2a8,(PlanningUnitDecPOMDPDiscrete *)this,500,0x2a,false);
  dVar5 = runSimulations((PlanningUnitDecPOMDPDiscrete *)this,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg reward of ",0xe);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,500);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," simulations: ",0xe);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_2a8);
  if (local_2f8 != 0) {
    operator_delete(local_2f0,local_2f8 << 3);
  }
  MDPValueIteration::~MDPValueIteration(local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.maxplus_updateT._M_dataplus._M_p != &local_258.maxplus_updateT.field_2) {
    operator_delete(local_258.maxplus_updateT._M_dataplus._M_p,
                    local_258.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    try
    {
        cout << "Instantiating the problem..."<<endl;
        DecPOMDPDiscreteInterface* decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
        cout << "...done."<<endl;

        // consider it an infinite-horizon problem by passing MAXHORIZON
        PlanningUnitDecPOMDPDiscrete *np = new NullPlanner(MAXHORIZON, decpomdp);

        ///---VI--------------------------------------------
        // only for reference, compute solution with value iteration
        cout << "Performing value iteration..."<<endl;
        MDPValueIteration vi(*np);
        vi.Plan();
        cout << "...done." <<endl;
        QTable q = vi.GetQTable(0); //<- infinite horizon, so get 1 value function of stage 0
        
        // output results of value iteration at a single state to allow
        // comparison with q learner results
        row_t row = q.GetRow(0);
        cout << setprecision(7)
             << "Here's first row (state 0) from VI result: \n" << row << endl;
        ///---end VI----------------------------------------------

        int nrRuns = 500;
        int seed = 42; //or: time(NULL)
        SimulationDecPOMDPDiscrete sim(*np, nrRuns, seed);

        double r;
        r = runSimulations(np, sim);
        cout << "Avg reward of "<< nrRuns << " simulations: " << r << endl << endl;

    }
    catch(E& e){ e.Print(); }

    return 0;
}